

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_deserializer.cpp
# Opt level: O2

bool __thiscall
duckdb::BinaryDeserializer::OnOptionalPropertyBegin
          (BinaryDeserializer *this,field_id_t field_id,char *s)

{
  field_id_t fVar1;
  
  fVar1 = PeekField(this);
  if (fVar1 == field_id) {
    ConsumeField(this);
  }
  return fVar1 == field_id;
}

Assistant:

bool BinaryDeserializer::OnOptionalPropertyBegin(const field_id_t field_id, const char *s) {
	auto next_field = PeekField();
	auto present = next_field == field_id;
	if (present) {
		ConsumeField();
	}
	return present;
}